

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O2

void __thiscall CT::ContourTracing(CT *this,int x,int y,int i_label,bool b_external)

{
  Mat1b *pMVar1;
  int iVar2;
  CT *pCVar3;
  undefined7 in_register_00000081;
  undefined1 auVar4 [16];
  bool b_isolated;
  int i_previous_contour_point;
  Point2i s;
  undefined1 local_58 [20];
  uint local_44;
  int local_40;
  int local_3c;
  int local_38;
  int iStack_34;
  
  pMVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  *(char *)((long)x + (long)y * **(long **)&pMVar1->field_0x48 + *(long *)&pMVar1->field_0x10) =
       (char)i_label;
  local_44 = (uint)CONCAT71(in_register_00000081,b_external) ^ 7;
  local_38 = x;
  iStack_34 = y;
  Tracer((CT *)local_58,(Point2i *)this,&stack0xffffffffffffffc8,(bool *)&local_44);
  local_58._16_4_ = local_58._4_4_;
  local_58._12_4_ = local_58._0_4_;
  do {
    do {
      pMVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      *(char *)((long)(int)local_58._0_4_ +
               (long)(int)local_58._4_4_ * **(long **)&pMVar1->field_0x48 +
               *(long *)&pMVar1->field_0x10) = (char)i_label;
      pCVar3 = this;
      Tracer((CT *)&stack0xffffffffffffffc0,(Point2i *)this,(int *)local_58,(bool *)&local_44);
      auVar4._4_4_ = -(uint)(local_38 == local_58._0_4_);
      auVar4._0_4_ = -(uint)(local_38 == local_58._0_4_);
      auVar4._8_4_ = -(uint)(iStack_34 == local_58._4_4_);
      auVar4._12_4_ = -(uint)(iStack_34 == local_58._4_4_);
      iVar2 = movmskpd((int)pCVar3,auVar4);
      local_58._0_4_ = local_40;
      local_58._4_4_ = local_3c;
    } while (iVar2 != 3);
  } while (local_3c != local_58._16_4_ || local_40 != local_58._12_4_);
  return;
}

Assistant:

void ContourTracing(int x, int y, int i_label, bool b_external) {
        cv::Point2i s(x, y), T, crd_next_point, crd_cur_point;

        // The current point is labeled 
		img_.data[s.y * img_.step[0] + s.x] = i_label;

        bool b_isolated(false);
        int i_previous_contour_point;
        if (b_external)
            i_previous_contour_point = 6;
        else
            i_previous_contour_point = 7;

        // First call to Tracer
        crd_next_point = T = Tracer(s, i_previous_contour_point, b_isolated);
        if (b_isolated)
            return;

        do {
            crd_cur_point = crd_next_point;
            img_.data[crd_cur_point.y * img_.step[0] + crd_cur_point.x] = i_label;
            crd_next_point = Tracer(crd_cur_point, i_previous_contour_point, b_isolated);
        } while (!(crd_cur_point == s && crd_next_point == T));
    }